

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativePreciseTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::generateAndVerifyShader
               (NegativeTestContext *ctx,ShaderType shaderType,TestPrecise test)

{
  bool bVar1;
  ContextType ctxType;
  char *pcVar2;
  ostream *poVar3;
  allocator<char> local_235;
  int length;
  string shaderSource;
  char *source;
  Shader shader;
  ostream local_1a0;
  
  glu::Shader::Shader(&shader,ctx->m_renderCtx,shaderType);
  ctxType.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
  pcVar2 = glu::getGLSLVersionDeclaration(bVar1 | GLSL_VERSION_310_ES);
  poVar3 = std::operator<<(&local_1a0,pcVar2);
  poVar3 = std::operator<<(poVar3,"\n");
  pcVar2 = "#extension GL_EXT_gpu_shader5 : enable\n";
  if (bVar1) {
    pcVar2 = glcts::fixed_sample_locations_values + 1;
  }
  std::operator<<(poVar3,pcVar2);
  if (shaderType == SHADERTYPE_TESSELLATION_EVALUATION) {
    pcVar2 = "#extension GL_EXT_tessellation_shader : enable\n";
    if (bVar1) {
      pcVar2 = glcts::fixed_sample_locations_values + 1;
    }
    poVar3 = std::operator<<(&local_1a0,pcVar2);
    pcVar2 = "layout(triangles, equal_spacing, cw) in;\n";
LAB_0136c291:
    std::operator<<(poVar3,pcVar2);
  }
  else {
    if (shaderType == SHADERTYPE_TESSELLATION_CONTROL) {
      pcVar2 = "#extension GL_EXT_tessellation_shader : enable\n";
      if (bVar1) {
        pcVar2 = glcts::fixed_sample_locations_values + 1;
      }
      poVar3 = std::operator<<(&local_1a0,pcVar2);
      pcVar2 = "layout(vertices = 3) out;\n";
      goto LAB_0136c291;
    }
    if (shaderType == SHADERTYPE_GEOMETRY) {
      pcVar2 = "#extension GL_EXT_geometry_shader : enable\n";
      if (bVar1) {
        pcVar2 = glcts::fixed_sample_locations_values + 1;
      }
      poVar3 = std::operator<<(&local_1a0,pcVar2);
      pcVar2 = "layout(max_vertices = 5) out;\n";
      goto LAB_0136c291;
    }
  }
  switch(test) {
  case TEST_PRECISE_AS_FUNCTION_NAME:
  case TEST_PRECISE_MACRO_AND_FUNCTION:
    poVar3 = std::operator<<(&local_1a0,"\n");
    pcVar2 = "void precise()\n";
    break;
  case TEST_PRECISE_AS_ARGUMENT_NAME:
  case TEST_PRECISE_MACRO_AND_ARGUMENT:
    poVar3 = std::operator<<(&local_1a0,"\n");
    pcVar2 = "void example(int precise)\n";
    break;
  default:
    goto switchD_0136c2b0_caseD_3;
  }
  poVar3 = std::operator<<(poVar3,pcVar2);
  poVar3 = std::operator<<(poVar3,"{\n");
  std::operator<<(poVar3,"}\n");
switchD_0136c2b0_caseD_3:
  poVar3 = std::operator<<(&local_1a0,"void main()\n");
  std::operator<<(poVar3,"{\n");
  if ((test & ~TEST_PRECISE_MACRO_AND_VARIABLE) == TEST_PRECISE_AS_VARIABLE_NAME) {
    std::operator<<(&local_1a0,"\tint precise = 1;\n");
  }
  std::operator<<(&local_1a0,"}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
  source = shaderSource._M_dataplus._M_p;
  length = (int)shaderSource._M_string_length;
  glu::Shader::setSources(&shader,1,&source,&length);
  glu::Shader::compile(&shader);
  glu::operator<<((ctx->super_CallLogWrapper).m_log,&shader);
  if (shader.m_info.compileOk == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a0,"Shader was not expected to compile.",&local_235);
    NegativeTestContext::fail(ctx,(string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_1a0);
  }
  std::__cxx11::string::~string((string *)&shaderSource);
  glu::Shader::~Shader(&shader);
  return;
}

Assistant:

void generateAndVerifyShader (NegativeTestContext& ctx, glu::ShaderType shaderType, TestPrecise test)
{
	glu::Shader			shader			(ctx.getRenderContext(), shaderType);
	std::string			shaderSource	= generateShaderSource(ctx, shaderType, test);
	const char* const	source			= shaderSource.c_str();
	const int			length			= (int) shaderSource.size();

	shader.setSources(1, &source, &length);
	shader.compile();

	ctx.getLog() << shader;

	if (shader.getCompileStatus())
		ctx.fail("Shader was not expected to compile.");
}